

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireTest_getFoundationPile_Test::TestBody
          (SolitaireTest_getFoundationPile_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  PileId local_c;
  
  local_c.t = (anonymous_namespace)::lastFoundationPileId;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Solitaire::getFoundationPile(&(this->super_SolitaireTest).solitaire,&local_c);
  local_28.data_ = (AssertHelperData *)(this->super_SolitaireTest).lastFoundationPileMock;
  testing::internal::
  CmpHelperEQ<solitaire::piles::interfaces::FoundationPile_const*,solitaire::piles::FoundationPileMock*>
            (local_20,"&solitaire.getFoundationPile(lastFoundationPileId)","&lastFoundationPileMock"
             ,(FoundationPile **)&local_30,(FoundationPileMock **)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_30._M_head_impl)[1])();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

TEST_F(SolitaireTest, getFoundationPile) {
    EXPECT_EQ(
        &solitaire.getFoundationPile(lastFoundationPileId),
        &lastFoundationPileMock
    );
}